

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFBarcodeValue.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
ZXing::Pdf417::BarcodeValue::value
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,BarcodeValue *this)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  const_iterator __end3;
  _Rb_tree_header *p_Var5;
  const_iterator __begin3;
  undefined8 local_30;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->_values)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var3 = (this->_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(this->_values)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = p_Var3;
    p_Var4 = p_Var3;
    if ((_Rb_tree_header *)p_Var3 != p_Var5) {
      while (p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2),
            (_Rb_tree_header *)p_Var2 != p_Var5) {
        if (*(int *)&p_Var4[1].field_0x4 < *(int *)&p_Var2[1].field_0x4) {
          p_Var4 = p_Var2;
        }
      }
    }
    iVar1 = *(int *)&p_Var4[1].field_0x4;
    for (; (_Rb_tree_header *)p_Var3 != p_Var5;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      local_30 = *(undefined8 *)(p_Var3 + 1);
      if (iVar1 == (int)((ulong)local_30 >> 0x20)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (__return_storage_ptr__,(value_type_conflict3 *)&local_30);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>
BarcodeValue::value() const
{
	std::vector<int> result;
	if (!_values.empty()) {
		int maxConfidence = std::max_element(_values.begin(), _values.end(), [](auto& l, auto& r) { return l.second < r.second; })->second;
		for (auto [value, count] : _values)
			if (count == maxConfidence)
				result.push_back(value);
	}
	return result;
}